

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O0

void test_keyvalue(CuTest *tc)

{
  critbit_tree tc_00;
  size_t sVar1;
  size_t keylen;
  size_t len;
  char *key;
  void *matches [2];
  char local_2a [8];
  char buffer [10];
  int i;
  int result;
  critbit_tree cb;
  CuTest *tc_local;
  
  cb.root = tc;
  memset(&i,0,8);
  builtin_strncpy(buffer + 2,"\f\r\x0e\x0f",4);
  sVar1 = strlen("herp");
  keylen = cb_new_kv("herp",sVar1,buffer + 2,4,local_2a);
  tc_00 = cb;
  sVar1 = strlen(local_2a);
  CuAssertIntEquals_LineMsg
            ((CuTest *)tc_00.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x112,(char *)0x0,(int)sVar1 + 5,(int)keylen);
  CuAssertStrEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x113,(char *)0x0,local_2a,"herp");
  cb_get_kv(local_2a,buffer + 6,4);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x115,(char *)0x0,buffer._2_4_,buffer._6_4_);
  buffer._6_4_ = cb_insert((critbit_tree *)&i,local_2a,keylen);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x118,(char *)0x0,0,buffer._6_4_);
  sVar1 = strlen("herp");
  buffer._6_4_ = cb_find_prefix((critbit_tree *)&i,"herp",sVar1 + 1,&key,2,0);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x11a,(char *)0x0,1,buffer._6_4_);
  cb_get_kv(key,buffer + 6,4);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x11c,(char *)0x0,buffer._2_4_,buffer._6_4_);
  return;
}

Assistant:

static void test_keyvalue(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();
  int result, i = 0x0F0E0D0C;
  char buffer[10];
  void * matches[2];
  const char * key = "herp";
  size_t len = strlen(key);

  len = cb_new_kv(key, len, &i, sizeof(int), buffer);
  CuAssertIntEquals(tc, (int)(strlen(buffer)+1+sizeof(int)), (int)len);
  CuAssertStrEquals(tc, buffer, key);
  cb_get_kv(buffer, &result, sizeof(int));
  CuAssertIntEquals(tc, i, result);

  result = cb_insert(&cb, buffer, len);
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  result = cb_find_prefix(&cb, key, strlen(key)+1, matches, 2, 0);
  CuAssertIntEquals(tc, 1, result);
  cb_get_kv(matches[0], &result, sizeof(int));
  CuAssertIntEquals(tc, i, result);
}